

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

size_t __thiscall
flexbuffers::Builder::CreateBlob(Builder *this,void *data,size_t len,size_t trailing,Type type)

{
  Value local_50;
  uint64_t local_40;
  size_type_conflict sloc;
  BitWidth local_30;
  Type TStack_2c;
  uint8_t byte_width;
  BitWidth bit_width;
  Type type_local;
  size_t trailing_local;
  size_t len_local;
  void *data_local;
  Builder *this_local;
  
  TStack_2c = type;
  _bit_width = trailing;
  trailing_local = len;
  len_local = (size_t)data;
  data_local = this;
  local_30 = WidthU(len);
  sloc._7_1_ = Align(this,local_30);
  Write<unsigned_long>(this,trailing_local,(ulong)sloc._7_1_);
  local_40 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
  WriteBytes(this,(void *)len_local,trailing_local + _bit_width);
  Value::Value(&local_50,local_40,TStack_2c,local_30);
  std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::push_back
            (&this->stack_,&local_50);
  return local_40;
}

Assistant:

size_t CreateBlob(const void *data, size_t len, size_t trailing, Type type) {
    auto bit_width = WidthU(len);
    auto byte_width = Align(bit_width);
    Write<uint64_t>(len, byte_width);
    auto sloc = buf_.size();
    WriteBytes(data, len + trailing);
    stack_.push_back(Value(static_cast<uint64_t>(sloc), type, bit_width));
    return sloc;
  }